

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

Boxed_Value
chaiscript::dispatch::detail::
call_func<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value),chaiscript::Boxed_Value,chaiscript::Boxed_Value,chaiscript::Boxed_Value,0ul,1ul>
          (element_type *param_1,undefined8 param_2,undefined8 *param_3,long *param_4,
          Type_Conversions_State *param_5)

{
  code *pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  chaiscript local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  chaiscript local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  pcVar1 = (code *)*param_3;
  boxed_cast<chaiscript::Boxed_Value>(local_30,(Boxed_Value *)*param_4,param_5);
  boxed_cast<chaiscript::Boxed_Value>(local_40,(Boxed_Value *)(*param_4 + 0x10),param_5);
  (*pcVar1)(param_1,local_30,local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = param_1;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }